

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

Reg ra_evict(ASMState *as,RegSet allow)

{
  uint uVar1;
  Reg RVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  IRRef ref;
  uint local_20;
  uint local_1c;
  
  if (allow < 0x10000) {
    ra_evict_cold_2();
    lVar4 = 0x3c;
    uVar3 = extraout_RAX;
  }
  else {
    ra_evict_cold_1();
    lVar4 = 0x7c;
    uVar3 = extraout_RAX_00;
    local_1c = local_20;
  }
  if (((uVar3 & 1) == 0) && (uVar5 = *(uint *)((long)as->cost + lVar4), uVar5 < local_1c)) {
    local_1c = uVar5;
  }
  ref = local_1c & 0xffff;
  if (0x7fff < ref) {
    uVar5 = allow & as->weakset;
    if ((uVar5 != 0) &&
       ((as->weakset >> (*(byte *)((long)as->ir + (ulong)ref * 8 + 6) & 0x1f) & 1) == 0)) {
      uVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      ref = (IRRef)(ushort)as->cost[uVar1];
    }
  }
  RVar2 = ra_restore(as,ref);
  return RVar2;
}

Assistant:

static Reg ra_evict(ASMState *as, RegSet allow)
{
  IRRef ref;
  RegCost cost = ~(RegCost)0;
  lj_assertA(allow != RSET_EMPTY, "evict from empty set");
  if (RID_NUM_FPR == 0 || allow < RID2RSET(RID_MAX_GPR)) {
    GPRDEF(MINCOST)
  } else {
    FPRDEF(MINCOST)
  }
  ref = regcost_ref(cost);
  lj_assertA(ra_iskref(ref) || (ref >= as->T->nk && ref < as->T->nins),
	     "evict of out-of-range IR %04d", ref - REF_BIAS);
  /* Preferably pick any weak ref instead of a non-weak, non-const ref. */
  if (!irref_isk(ref) && (as->weakset & allow)) {
    IRIns *ir = IR(ref);
    if (!rset_test(as->weakset, ir->r))
      ref = regcost_ref(as->cost[rset_pickbot((as->weakset & allow))]);
  }
  return ra_restore(as, ref);
}